

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.c
# Opt level: O0

int pp(char *filename,FILE *infile,FILE *outfile)

{
  int iVar1;
  int iVar2;
  int iVar3;
  option_t *poVar4;
  char *pcVar5;
  FILE *in_RDX;
  FILE *in_RSI;
  char *in_RDI;
  int curline;
  int loop;
  char *pl;
  uchar bom3;
  uchar bom2;
  uchar bom1;
  char *in_stack_ffffffffffffffd8;
  char *pcVar6;
  
  poVar4 = get_option(in_stack_ffffffffffffffd8);
  tabstop = (poVar4->value).num;
  f = (FILE *)in_RSI;
  filnam = in_RDI;
  iVar1 = fgetc(in_RSI);
  iVar2 = fgetc((FILE *)f);
  iVar3 = fgetc((FILE *)f);
  if ((((char)iVar1 != -0x11) || ((char)iVar2 != -0x45)) || ((char)iVar3 != -0x41)) {
    rewind((FILE *)f);
  }
  c = 10;
  l = fgetc((FILE *)f);
  mlc = 0;
  line = 1;
  fprintf(in_RDX,"# 1 \"%s\"\n",in_RDI);
  do {
    iVar1 = line;
    linebuf[0] = '\0';
    column = 0;
    update_line = 0;
    iVar2 = readline(linebuf);
    line = line + 1;
    pcVar6 = linebuf;
    while (*pcVar6 != '\0') {
      pcVar5 = pcVar6 + 1;
      fputc((int)*pcVar6,in_RDX);
      pcVar6 = pcVar5;
    }
    if (update_line != 0) {
      fprintf(in_RDX,"# %d \"%s\"\n",(ulong)(uint)line,in_RDI);
    }
    process(iVar1);
  } while (iVar2 != 0);
  return 1;
}

Assistant:

int pp(const char* filename, FILE* infile, FILE* outfile)
{
    unsigned char bom1, bom2, bom3;
    char* pl;
    int loop;
    
    tabstop = get_option("-ftabstop=")->value.num;
    f = infile;

    
    filnam = filename;

    /* accept UTF-8 BOM */
    bom1 = fgetc(f);
    bom2 = fgetc(f);
    bom3 = fgetc(f);
    if (!(bom1 == 0xEF && bom2 == 0xBB && bom3 == 0xBF))
        rewind(f);

    c = '\n';
    l = fgetc(f);
    mlc = 0;
    line = 1;

    fprintf(outfile, "# 1 \"%s\"\n", filename);
    do
    {
        int curline = line;
        loop = 0;
        pl = linebuf;
        *pl = 0;
        column = 0;    
        update_line = 0;
        
        loop = readline(pl);  
        ++line;  
        
        pl = linebuf;
        while (*pl)
            fputc(*pl++, outfile);
            
        if (update_line)
            fprintf(outfile, "# %d \"%s\"\n", line, filename);
            
        process(curline);
            
     
    } while (loop);

    return 1;
}